

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_script.c
# Opt level: O1

ngx_int_t ngx_http_complex_value
                    (ngx_http_request_t *r,ngx_http_complex_value_t *val,ngx_str_t *value)

{
  u_char *puVar1;
  long lVar2;
  size_t size;
  long *plStack_88;
  ngx_http_script_engine_t e;
  
  if (val->lengths != (void *)0x0) {
    ngx_http_script_flush_complex_value(r,val);
    e._64_8_ = 0;
    e.line.len = 0;
    e.line.data = (u_char *)0x0;
    e.buf.len = 0;
    e.buf.data = (u_char *)0x0;
    e.pos = (u_char *)0x0;
    e.sp = (ngx_http_variable_value_t *)0x0;
    e.ip = (u_char *)0x0;
    plStack_88 = (long *)val->lengths;
    e.args = &DAT_00000001;
    e.status = (ngx_int_t)r;
    if (*plStack_88 == 0) {
      size = 0;
    }
    else {
      size = 0;
      do {
        lVar2 = (*(code *)*plStack_88)(&plStack_88);
        size = size + lVar2;
      } while (*plStack_88 != 0);
    }
    value->len = size;
    e.ip = (u_char *)ngx_pnalloc(r->pool,size);
    value->data = e.ip;
    if (e.ip == (u_char *)0x0) {
      return -1;
    }
    plStack_88 = (long *)val->values;
    val = (ngx_http_complex_value_t *)&e.sp;
    e.sp = (ngx_http_variable_value_t *)value->len;
    e.buf.len = (size_t)value->data;
    if (*plStack_88 != 0) {
      do {
        (*(code *)*plStack_88)(&plStack_88);
      } while (*plStack_88 != 0);
    }
  }
  puVar1 = (u_char *)((ngx_str_t *)&(val->value).data)->len;
  value->len = (size_t)(val->value).len;
  value->data = puVar1;
  return 0;
}

Assistant:

ngx_int_t
ngx_http_complex_value(ngx_http_request_t *r, ngx_http_complex_value_t *val,
    ngx_str_t *value)
{
    size_t                        len;
    ngx_http_script_code_pt       code;
    ngx_http_script_len_code_pt   lcode;
    ngx_http_script_engine_t      e;

    if (val->lengths == NULL) {
        *value = val->value;
        return NGX_OK;
    }

    ngx_http_script_flush_complex_value(r, val);

    ngx_memzero(&e, sizeof(ngx_http_script_engine_t));

    e.ip = val->lengths;
    e.request = r;
    e.flushed = 1;

    len = 0;

    while (*(uintptr_t *) e.ip) {
        lcode = *(ngx_http_script_len_code_pt *) e.ip;
        len += lcode(&e);
    }

    value->len = len;
    value->data = ngx_pnalloc(r->pool, len);
    if (value->data == NULL) {
        return NGX_ERROR;
    }

    e.ip = val->values;
    e.pos = value->data;
    e.buf = *value;

    while (*(uintptr_t *) e.ip) {
        code = *(ngx_http_script_code_pt *) e.ip;
        code((ngx_http_script_engine_t *) &e);
    }

    *value = e.buf;

    return NGX_OK;
}